

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int should_force_mode_cost_update(AV1_COMP *cpi)

{
  int iVar1;
  AV1_COMP *in_RDI;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  REAL_TIME_SPEED_FEATURES *rt_sf;
  bool local_29;
  uint local_4;
  
  if (((in_RDI->sf).rt_sf.frame_level_mode_cost_update & 1U) == 0) {
    local_4 = 0;
  }
  else if ((in_RDI->oxcf).algo_cfg.cdf_update_mode == '\x02') {
    local_4 = (uint)(in_RDI->frames_since_last_update == 1);
  }
  else {
    if ((in_RDI->oxcf).algo_cfg.cdf_update_mode == '\x01') {
      if (((in_RDI->svc).number_spatial_layers == 1) && ((in_RDI->svc).number_temporal_layers == 1))
      {
        iVar1 = frame_is_intra_only(&in_RDI->common);
        local_29 = true;
        if (iVar1 == 0) {
          iVar1 = is_frame_resize_pending(in_RDI);
          local_29 = true;
          if ((((iVar1 == 0) && (local_29 = true, (in_RDI->rc).high_source_sad == 0)) &&
              (local_29 = true, 9 < (in_RDI->rc).frames_since_key)) &&
             (local_29 = true, 9 < in_RDI->cyclic_refresh->counter_encode_maxq_scene_change)) {
            local_29 = ((in_RDI->common).current_frame.frame_number & 7) == 0;
          }
        }
        return (uint)local_29;
      }
      if (1 < (in_RDI->svc).number_temporal_layers) {
        return (uint)((in_RDI->svc).temporal_layer_id != (in_RDI->svc).number_temporal_layers + -1);
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int should_force_mode_cost_update(const AV1_COMP *cpi) {
  const REAL_TIME_SPEED_FEATURES *const rt_sf = &cpi->sf.rt_sf;
  if (!rt_sf->frame_level_mode_cost_update) {
    return false;
  }

  if (cpi->oxcf.algo_cfg.cdf_update_mode == 2) {
    return cpi->frames_since_last_update == 1;
  } else if (cpi->oxcf.algo_cfg.cdf_update_mode == 1) {
    if (cpi->svc.number_spatial_layers == 1 &&
        cpi->svc.number_temporal_layers == 1) {
      const AV1_COMMON *const cm = &cpi->common;
      const RATE_CONTROL *const rc = &cpi->rc;

      return frame_is_intra_only(cm) || is_frame_resize_pending(cpi) ||
             rc->high_source_sad || rc->frames_since_key < 10 ||
             cpi->cyclic_refresh->counter_encode_maxq_scene_change < 10 ||
             cm->current_frame.frame_number % 8 == 0;
    } else if (cpi->svc.number_temporal_layers > 1) {
      return cpi->svc.temporal_layer_id != cpi->svc.number_temporal_layers - 1;
    }
  }

  return false;
}